

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gguf.cpp
# Opt level: O2

void __thiscall gguf_kv::cast(gguf_kv *this,gguf_type new_type)

{
  size_t sVar1;
  
  sVar1 = gguf_type_size(GGUF_TYPE_UINT8);
  if ((ulong)((long)(this->data).super__Vector_base<signed_char,_std::allocator<signed_char>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
             (long)(this->data).super__Vector_base<signed_char,_std::allocator<signed_char>_>.
                   _M_impl.super__Vector_impl_data._M_start) % sVar1 == 0) {
    this->type = new_type;
    return;
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/gguf.cpp",0xc4,
             "GGML_ASSERT(%s) failed","data.size() % new_type_size == 0");
}

Assistant:

void cast(const enum gguf_type new_type) {
        const size_t new_type_size = gguf_type_size(new_type);
        GGML_ASSERT(data.size() % new_type_size == 0);
        type = new_type;
    }